

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O1

int xmlTextWriterStartAttribute(xmlTextWriterPtr writer,xmlChar *name)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  xmlLinkPtr lk;
  void *pvVar6;
  int iVar7;
  
  iVar7 = -1;
  if ((((name != (xmlChar *)0x0 && writer != (xmlTextWriterPtr)0x0) && (*name != '\0')) &&
      (lk = xmlListFront(writer->nodes), lk != (xmlLinkPtr)0x0)) &&
     (pvVar6 = xmlLinkGetData(lk), pvVar6 != (void *)0x0)) {
    if (*(int *)((long)pvVar6 + 8) == 1) {
      iVar1 = 0;
    }
    else {
      if (*(int *)((long)pvVar6 + 8) != 2) {
        return -1;
      }
      iVar1 = xmlTextWriterEndAttribute(writer);
      if (iVar1 < 0) {
        return -1;
      }
    }
    iVar2 = xmlOutputBufferWriteString(writer->out," ");
    if (((-1 < iVar2) && (iVar3 = xmlOutputBufferWriteString(writer->out,(char *)name), -1 < iVar3))
       && ((iVar4 = xmlOutputBufferWriteString(writer->out,"="), -1 < iVar4 &&
           (iVar5 = xmlOutputBufferWrite(writer->out,1,&writer->qchar), -1 < iVar5)))) {
      iVar7 = iVar3 + iVar4 + iVar2 + iVar1 + iVar5;
      *(undefined4 *)((long)pvVar6 + 8) = 2;
    }
  }
  return iVar7;
}

Assistant:

int
xmlTextWriterStartAttribute(xmlTextWriterPtr writer, const xmlChar * name)
{
    int count;
    int sum;
    xmlLinkPtr lk;
    xmlTextWriterStackEntry *p;

    DEBUG_ENTER(("xmlTextWriterStartAttribute(%p, %s);\n", writer, name));

    if ((writer == NULL) || (name == NULL) || (*name == '\0'))
        RETURN_INT(-1);

    sum = 0;
    lk = xmlListFront(writer->nodes);
    if (lk == 0)
        RETURN_INT(-1);

    p = (xmlTextWriterStackEntry *) xmlLinkGetData(lk);
    if (p == 0)
        RETURN_INT(-1);

    switch (p->state) {
        case XML_TEXTWRITER_ATTRIBUTE:
            count = xmlTextWriterEndAttribute(writer);
            if (count < 0)
                RETURN_INT(-1);
            sum += count;
            /* fallthrough */
        case XML_TEXTWRITER_NAME:
            count = xmlOutputBufferWriteString(writer->out, " ");
            if (count < 0)
                RETURN_INT(-1);
            sum += count;
            count =
                xmlOutputBufferWriteString(writer->out,
                                           (const char *) name);
            if (count < 0)
                RETURN_INT(-1);
            sum += count;
            count = xmlOutputBufferWriteString(writer->out, "=");
            if (count < 0)
                RETURN_INT(-1);
            sum += count;
            count = xmlOutputBufferWrite(writer->out, 1, &writer->qchar);
            if (count < 0)
                RETURN_INT(-1);
            sum += count;
            p->state = XML_TEXTWRITER_ATTRIBUTE;
            break;
        default:
            RETURN_INT(-1);
    }

    RETURN_INT(sum);
}